

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ptls_openssl_encrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  ptls_buffer_t *ppVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER_CTX *ctx;
  HMAC_CTX *ctx_00;
  long lVar4;
  uchar *puVar5;
  int clen;
  ptls_buffer_t *local_40;
  uchar *local_38;
  
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar2 = 0x201;
  }
  else {
    ctx_00 = (HMAC_CTX *)HMAC_CTX_new();
    if (ctx_00 == (HMAC_CTX *)0x0) {
      iVar2 = 0x201;
    }
    else {
      iVar2 = ptls_buffer_reserve(buf,src.len + 0x80);
      if (iVar2 == 0) {
        local_38 = buf->base + buf->off;
        local_40 = buf;
        iVar3 = (*cb)(local_38,buf->base + buf->off + 0x10,(EVP_CIPHER_CTX *)ctx,(HMAC_CTX *)ctx_00,
                      1);
        iVar2 = 0x203;
        if (iVar3 != 0) {
          puVar5 = local_38 + 0x20;
          iVar3 = EVP_EncryptUpdate(ctx,puVar5,&clen,src.base,(int)src.len);
          if (iVar3 != 0) {
            lVar4 = (long)clen;
            iVar3 = EVP_EncryptFinal_ex(ctx,puVar5 + lVar4,&clen);
            if (iVar3 != 0) {
              puVar5 = puVar5 + lVar4 + clen;
              iVar3 = HMAC_Update(ctx_00,local_40->base + local_40->off,
                                  (long)puVar5 - (long)(local_40->base + local_40->off));
              if (iVar3 != 0) {
                iVar3 = HMAC_Final(ctx_00,puVar5,(uint *)0x0);
                ppVar1 = local_40;
                if (iVar3 != 0) {
                  lVar4 = HMAC_size(ctx_00);
                  if (ppVar1->base + ppVar1->capacity < puVar5 + lVar4) {
                    __assert_fail("dst <= buf->base + buf->capacity",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/openssl.c"
                                  ,0x532,
                                  "int ptls_openssl_encrypt_ticket(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, HMAC_CTX *, int))"
                                 );
                  }
                  ppVar1->off = (long)(puVar5 + lVar4) - (long)ppVar1->base;
                  iVar2 = 0;
                }
              }
            }
          }
        }
      }
    }
    cleanup_cipher_ctx((EVP_CIPHER_CTX *)ctx);
    if (ctx_00 != (HMAC_CTX *)0x0) {
      HMAC_CTX_free(ctx_00);
    }
  }
  return iVar2;
}

Assistant:

int ptls_openssl_encrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!HMAC_Update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) || !HMAC_Final(hctx, dst, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += HMAC_size(hctx);

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        cleanup_cipher_ctx(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}